

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall
helics::CloningFilter::setString(CloningFilter *this,string_view property,string_view val)

{
  long lVar1;
  element_type *peVar2;
  int iVar3;
  char *__s1;
  size_t __n;
  size_type __rlen;
  
  __s1 = property._M_str;
  __n = property._M_len;
  lVar1 = __n - 4;
  switch(lVar1) {
  case 0:
switchD_0026178c_caseD_0:
    iVar3 = bcmp(__s1,"dest",__n);
    if (iVar3 == 0) goto LAB_00261a51;
    switch(__n) {
    case 8:
      goto switchD_0026178c_caseD_4;
    default:
      goto switchD_0026178c_caseD_1;
    case 0xb:
      goto switchD_0026178c_caseD_7;
    case 0xc:
      goto switchD_0026178c_caseD_8;
    case 0xd:
      break;
    case 0xf:
      goto switchD_0026178c_caseD_b;
    case 0x12:
      goto switchD_0026178c_caseD_e;
    }
  default:
    goto switchD_0026178c_caseD_1;
  case 2:
    iVar3 = bcmp(__s1,"source",__n);
    if (iVar3 == 0) goto LAB_00261a1d;
    switch(lVar1) {
    case 0:
      goto switchD_0026178c_caseD_0;
    default:
      goto switchD_0026178c_caseD_1;
    case 4:
      goto switchD_0026178c_caseD_4;
    case 6:
      goto switchD_0026178c_caseD_6;
    case 7:
      goto switchD_0026178c_caseD_7;
    case 8:
      goto switchD_0026178c_caseD_8;
    case 9:
      break;
    case 0xb:
      goto switchD_0026178c_caseD_b;
    case 0xe:
      goto switchD_0026178c_caseD_e;
    }
  case 4:
switchD_0026178c_caseD_4:
    iVar3 = bcmp(__s1,"add dest",__n);
    if (iVar3 == 0) goto LAB_00261a51;
    switch(__n) {
    case 8:
      iVar3 = bcmp(__s1,"endpoint",__n);
      if (iVar3 != 0) {
        switch(__n) {
        case 0xb:
          goto switchD_0026189c_caseD_b;
        case 0xc:
          goto switchD_0026178c_caseD_8;
        case 0xd:
          goto switchD_0026178c_caseD_9;
        default:
          goto switchD_0026178c_caseD_1;
        case 0xf:
          goto switchD_0026189c_caseD_f;
        case 0x12:
          goto switchD_0026178c_caseD_e;
        }
      }
      goto LAB_00261a3e;
    default:
      goto switchD_0026178c_caseD_1;
    case 0xb:
      goto switchD_0026189c_caseD_b;
    case 0xc:
      goto switchD_0026178c_caseD_8;
    case 0xd:
      break;
    case 0xf:
      goto switchD_0026189c_caseD_f;
    case 0x12:
      goto switchD_0026178c_caseD_e;
    }
  case 6:
switchD_0026178c_caseD_6:
    iVar3 = bcmp(__s1,"add source",__n);
    if (iVar3 == 0) {
LAB_00261a1d:
      Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
      return;
    }
    switch(lVar1) {
    case 0:
      goto switchD_0026178c_caseD_0;
    default:
      goto switchD_0026178c_caseD_1;
    case 4:
      goto switchD_0026178c_caseD_4;
    case 7:
      goto switchD_0026178c_caseD_7;
    case 8:
      goto switchD_0026178c_caseD_8;
    case 9:
      break;
    case 0xb:
      goto switchD_0026178c_caseD_b;
    case 0xe:
      goto switchD_0026178c_caseD_e;
    }
  case 7:
switchD_0026178c_caseD_7:
    iVar3 = bcmp(__s1,"destination",__n);
    if (iVar3 == 0) goto LAB_00261a51;
    switch(__n) {
    case 8:
      goto switchD_0026178c_caseD_4;
    default:
      goto switchD_0026178c_caseD_1;
    case 0xb:
      goto switchD_0026189c_caseD_b;
    case 0xc:
      goto switchD_0026178c_caseD_8;
    case 0xd:
      break;
    case 0xf:
      goto switchD_0026178c_caseD_b;
    case 0x12:
      goto switchD_0026178c_caseD_e;
    }
  case 8:
switchD_0026178c_caseD_8:
    iVar3 = bcmp(__s1,"add endpoint",__n);
    if (iVar3 == 0) {
LAB_00261a3e:
      Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
LAB_00261a51:
      Interface::addDestinationTarget((Interface *)this,val,UNKNOWN);
      return;
    }
    switch(__n) {
    case 0xb:
switchD_0026189c_caseD_b:
      iVar3 = bcmp(__s1,"remove dest",__n);
      if (iVar3 == 0) goto LAB_002619f2;
      if (__n == 0xf) goto switchD_0026189c_caseD_f;
      if (__n != 0xd) goto switchD_0026178c_caseD_1;
      break;
    default:
      goto switchD_0026178c_caseD_1;
    case 0xd:
      break;
    case 0xf:
      goto switchD_0026189c_caseD_f;
    case 0x12:
      goto switchD_0026178c_caseD_e;
    }
    break;
  case 9:
    break;
  case 0xb:
switchD_0026178c_caseD_b:
    iVar3 = bcmp(__s1,"add destination",__n);
    if (iVar3 == 0) goto LAB_00261a51;
    switch(__n) {
    case 8:
      goto switchD_0026178c_caseD_4;
    default:
      goto switchD_0026178c_caseD_1;
    case 0xb:
      goto switchD_0026189c_caseD_b;
    case 0xc:
      goto switchD_0026178c_caseD_8;
    case 0xd:
      break;
    case 0xf:
      goto switchD_0026189c_caseD_f;
    case 0x12:
      goto switchD_0026178c_caseD_e;
    }
  case 0xe:
switchD_0026178c_caseD_e:
    iVar3 = bcmp(__s1,"remove destination",__n);
    if (iVar3 == 0) goto LAB_002619f2;
    if (__n == 0xf) goto switchD_0026189c_caseD_f;
    if (__n != 0xd) {
      if (__n != 0xb) goto switchD_0026178c_caseD_1;
      goto switchD_0026189c_caseD_b;
    }
  }
switchD_0026178c_caseD_9:
  iVar3 = bcmp(__s1,"remove source",__n);
  if (iVar3 != 0) {
    if (__n == 0xf) {
switchD_0026189c_caseD_f:
      iVar3 = bcmp(__s1,"remove endpoint",__n);
      if (iVar3 == 0) goto LAB_002619f2;
    }
switchD_0026178c_caseD_1:
    peVar2 = (this->super_Filter).filtOp.
             super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      (*peVar2->_vptr_FilterOperations[3])(peVar2,__n,__s1,val._M_len,val._M_str);
      return;
    }
    return;
  }
LAB_002619f2:
  Interface::removeTarget((Interface *)this,val);
  return;
}

Assistant:

void CloningFilter::setString(std::string_view property, std::string_view val)
{
    if ((property == "source") || (property == "add source")) {
        addSourceTarget(val);
    } else if (property == "dest" || property == "destination" || property == "add destination" ||
               property == "add dest") {
        addDestinationTarget(val);
    } else if (property == "endpoint" || property == "add endpoint") {
        addSourceTarget(val);
        addDestinationTarget(val);
    } else if (property == "remove destination" || property == "remove dest" ||
               property == "remove source" || property == "remove endpoint") {
        removeTarget(val);
    } else {
        Filter::setString(property, val);
    }
}